

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_memory_buffer<char,_176UL,_std::allocator<char>_>::move
          (basic_memory_buffer<char,_176UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_176UL,_std::allocator<char>_> *other)

{
  char *pcVar1;
  size_t new_size;
  size_t buf_capacity;
  size_t capacity;
  size_t size;
  char *data;
  allocator<char> *other_alloc;
  allocator<char> *this_alloc;
  basic_memory_buffer<char,_176UL,_std::allocator<char>_> *other_local;
  basic_memory_buffer<char,_176UL,_std::allocator<char>_> *this_local;
  
  pcVar1 = internal::basic_buffer<char>::data((basic_buffer<char> *)other);
  new_size = internal::basic_buffer<char>::size((basic_buffer<char> *)other);
  buf_capacity = internal::basic_buffer<char>::capacity((basic_buffer<char> *)other);
  if (pcVar1 == other->store_) {
    internal::basic_buffer<char>::set((basic_buffer<char> *)this,this->store_,buf_capacity);
    pcVar1 = internal::make_checked<char>(this->store_,buf_capacity);
    std::uninitialized_copy<char*,char*>(other->store_,other->store_ + new_size,pcVar1);
  }
  else {
    internal::basic_buffer<char>::set((basic_buffer<char> *)this,pcVar1,buf_capacity);
    internal::basic_buffer<char>::set((basic_buffer<char> *)other,other->store_,0);
  }
  internal::basic_buffer<char>::resize((basic_buffer<char> *)this,new_size);
  return;
}

Assistant:

void move(basic_memory_buffer &other) {
    Allocator &this_alloc = *this, &other_alloc = other;
    this_alloc = std::move(other_alloc);
    T* data = other.data();
    std::size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      std::uninitialized_copy(other.store_, other.store_ + size,
                              internal::make_checked(store_, capacity));
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
    }
    this->resize(size);
  }